

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintFieldName
          (FastFieldValuePrinter *this,Message *param_1,Reflection *param_2,FieldDescriptor *field,
          BaseTextGenerator *generator)

{
  bool bVar1;
  Descriptor *pDVar2;
  ushort *puVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  ulong uVar4;
  char *pcVar5;
  string_view sVar6;
  
  if ((field->field_0x1 & 8) == 0) {
    bVar1 = internal::cpp::IsGroupLike(field);
    if (bVar1) {
      pDVar2 = FieldDescriptor::message_type(field);
      puVar3 = (ushort *)(pDVar2->all_names_).payload_;
    }
    else {
      puVar3 = (ushort *)(field->all_names_).payload_;
    }
    uVar4 = (ulong)*puVar3;
    pcVar5 = (char *)(~uVar4 + (long)puVar3);
    UNRECOVERED_JUMPTABLE = generator->_vptr_BaseTextGenerator[5];
  }
  else {
    (*generator->_vptr_BaseTextGenerator[5])(generator,"[",1);
    sVar6 = FieldDescriptor::PrintableNameForExtension(field);
    (*generator->_vptr_BaseTextGenerator[5])(generator,sVar6._M_str,sVar6._M_len);
    UNRECOVERED_JUMPTABLE = generator->_vptr_BaseTextGenerator[5];
    pcVar5 = "]";
    uVar4 = 1;
  }
  (*UNRECOVERED_JUMPTABLE)(generator,pcVar5,uVar4);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintFieldName(
    const Message& /*message*/, const Reflection* /*reflection*/,
    const FieldDescriptor* field, BaseTextGenerator* generator) const {
  if (field->is_extension()) {
    generator->PrintLiteral("[");
    generator->PrintString(field->PrintableNameForExtension());
    generator->PrintLiteral("]");
  } else if (internal::cpp::IsGroupLike(*field)) {
    // Groups must be serialized with their original capitalization.
    generator->PrintString(field->message_type()->name());
  } else {
    generator->PrintString(field->name());
  }
}